

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O3

uint8_t * __thiscall
Lodtalk::MethodAssembler::SendMessage::encode(SendMessage *this,uint8_t *buffer)

{
  uint uVar1;
  uint8_t uVar2;
  int iVar3;
  uint8_t *extraout_RAX;
  undefined7 uVar4;
  undefined1 uVar5;
  
  uVar5 = SUB81(this,0);
  uVar4 = (undefined7)((ulong)this >> 8);
  iVar3 = this->argumentCount;
  if (iVar3 == 2) {
    iVar3 = this->selectorIndex;
    if (iVar3 < 0x10) {
      uVar2 = (char)iVar3 + 0xa0;
LAB_0013ee62:
      *buffer = uVar2;
      return buffer + 1;
    }
  }
  else if (iVar3 == 1) {
    iVar3 = this->selectorIndex;
    if (iVar3 < 0x10) {
      uVar2 = (char)iVar3 + 0x90;
      goto LAB_0013ee62;
    }
  }
  else if (iVar3 == 0) {
    iVar3 = this->selectorIndex;
    if (iVar3 < 0x10) {
      uVar2 = (char)iVar3 + 0x80;
      goto LAB_0013ee62;
    }
  }
  else {
    if (7 < iVar3) goto LAB_0013ee96;
    iVar3 = this->selectorIndex;
  }
  if (iVar3 < 0x20) {
    *buffer = 0xea;
    buffer[1] = ((byte)this->argumentCount & 7) + (char)this->selectorIndex * '\b';
    return buffer + 2;
  }
  encode();
LAB_0013ee96:
  encode();
  iVar3 = *(int *)(CONCAT71(uVar4,uVar5) + 0x28);
  uVar1 = *(uint *)(CONCAT71(uVar4,uVar5) + 0x2c);
  uVar5 = uVar1 < 3;
  if ((bool)uVar5 && iVar3 < 0x10) {
    return &DAT_00000001;
  }
  if ((int)uVar1 < 8) {
    if (iVar3 < 0x20) {
      return (uint8_t *)0x2;
    }
  }
  else {
    computeMaxSize();
  }
  computeMaxSize();
  operator_delete((void *)CONCAT71(uVar4,uVar5));
  return extraout_RAX;
}

Assistant:

virtual uint8_t *encode(uint8_t *buffer)
	{
		if(argumentCount == 0 && selectorIndex < BytecodeSet::SendShortArgs0RangeSize)
		{
			*buffer++ = uint8_t(BytecodeSet::SendShortArgs0First + selectorIndex);
			return buffer;
		}
		if(argumentCount == 1 && selectorIndex < BytecodeSet::SendShortArgs1RangeSize)
		{
			*buffer++ = uint8_t(BytecodeSet::SendShortArgs1First + selectorIndex);
			return buffer;
		}
		if(argumentCount == 2 && selectorIndex < BytecodeSet::SendShortArgs2RangeSize)
		{
			*buffer++ = uint8_t(BytecodeSet::SendShortArgs2First + selectorIndex);
			return buffer;
		}

		if(argumentCount > BytecodeSet::Send_ArgumentCountMask)
			LODTALK_UNIMPLEMENTED();

		if(selectorIndex > BytecodeSet::Send_LiteralIndexMask)
			LODTALK_UNIMPLEMENTED();

		*buffer++ = BytecodeSet::Send;
		*buffer++ = (argumentCount & BytecodeSet::Send_ArgumentCountMask) |
			((selectorIndex & BytecodeSet::Send_LiteralIndexMask) << BytecodeSet::Send_LiteralIndexShift);
		return buffer;
	}